

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImBoolVector::Resize(ImBoolVector *this,int sz)

{
  undefined4 in_ESI;
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  ImVector<int>::resize
            ((ImVector<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  memset(*(void **)(in_RDI + 2),0,(long)*in_RDI << 2);
  return;
}

Assistant:

void            Resize(int sz)          { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }